

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

bool __thiscall
pybind11::detail::values_and_holders::is_redundant_value_and_holder
          (values_and_holders *this,value_and_holder *vh)

{
  pointer pptVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = vh->index;
  if (uVar3 == 0) {
    return false;
  }
  uVar4 = 0;
  do {
    pptVar1 = (this->tinfo->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar2 = PyType_IsSubtype(pptVar1[uVar4]->type,pptVar1[uVar3]->type);
    bVar5 = iVar2 != 0;
    if (bVar5) {
      return bVar5;
    }
    uVar4 = uVar4 + 1;
    uVar3 = vh->index;
  } while (uVar4 < uVar3);
  return bVar5;
}

Assistant:

bool is_redundant_value_and_holder(const value_and_holder &vh) {
        for (size_t i = 0; i < vh.index; i++) {
            if (PyType_IsSubtype(tinfo[i]->type, tinfo[vh.index]->type) != 0) {
                return true;
            }
        }
        return false;
    }